

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<9,_7,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  float fVar2;
  int i;
  long lVar3;
  float fVar4;
  Vector<float,_3> res;
  float local_28 [6];
  undefined8 local_10;
  float local_8;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    fVar1 = evalCtx->in[1].m_data[1];
    fVar2 = evalCtx->in[1].m_data[2];
    local_8 = evalCtx->in[1].m_data[3];
    local_28[0] = evalCtx->in[0].m_data[0];
    local_28[1] = evalCtx->in[0].m_data[1];
    fVar4 = evalCtx->in[0].m_data[2];
  }
  else {
    fVar1 = -0.6;
    fVar2 = -0.6;
    local_8 = -0.1;
    local_28[0] = -0.6;
    local_28[1] = -0.6;
    fVar4 = -0.2;
  }
  local_28[2] = fVar4;
  local_10 = CONCAT44(fVar2,fVar1);
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar3 = 0;
  do {
    res.m_data[lVar3] = local_28[lVar3] + *(float *)((long)&local_10 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_28[2] = 0.0;
  local_28[3] = 1.4013e-45;
  local_28[4] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_28[lVar3]] = res.m_data[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(in0);
	}